

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

bool anon_unknown.dwarf_1aa64e::RenderTargetImpl::isActive(Uint64 id)

{
  bool bVar1;
  pointer ppVar2;
  unsigned_long_long in_RDI;
  iterator iter;
  map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  Uint64 local_20;
  _Self local_18;
  unsigned_long_long local_10;
  bool local_1;
  
  local_10 = in_RDI;
  local_20 = sf::Context::getActiveContextId();
  local_18._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type_conflict1 *)0x20c344);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_unsigned_long_long,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::operator==(&local_18,&local_28);
  local_1 = true;
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>::
             operator->((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>
                         *)0x20c380);
    local_1 = ppVar2->second != local_10;
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool isActive(sf::Uint64 id)
        {
            ContextRenderTargetMap::iterator iter = contextRenderTargetMap.find(sf::Context::getActiveContextId());

            if ((iter == contextRenderTargetMap.end()) || (iter->second != id))
                return false;

            return true;
        }